

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

long go(void)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  Section *in_RDX;
  ImageSize *in_RSI;
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  *in_RDI;
  Gradient *in_R8;
  int in_R9D;
  int iVar3;
  bool bVar4;
  vector<double,_std::allocator<double>_> durations;
  vector<PixelColor,_std::allocator<PixelColor>_> image_data;
  vector<CalculationResult,_std::allocator<CalculationResult>_> results_per_point;
  vector<int,_std::allocator<int>_> iterations_histogram;
  double local_a0;
  _Vector_base<double,_std::allocator<double>_> local_98;
  _Vector_base<PixelColor,_std::allocator<PixelColor>_> local_78;
  _Vector_base<CalculationResult,_std::allocator<CalculationResult>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)(in_ECX + 1),
             (allocator_type *)&local_60);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::vector
            ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)&local_60,
             (long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_78);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::vector
            ((vector<PixelColor,_std::allocator<PixelColor>_> *)&local_78,
             (long)in_RSI->height * (long)in_RSI->width,(allocator_type *)&local_98);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = 0;
  if (0 < in_R9D) {
    iVar3 = in_R9D;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    lVar1 = std::chrono::_V2::system_clock::now();
    mandelbrot_calc(in_RSI,in_RDX,in_ECX,(vector<int,_std::allocator<int>_> *)&local_48,
                    (vector<CalculationResult,_std::allocator<CalculationResult>_> *)&local_60);
    mandelbrot_colorize(in_ECX,in_R8,(vector<PixelColor,_std::allocator<PixelColor>_> *)&local_78,
                        (vector<int,_std::allocator<int>_> *)&local_48,
                        (vector<CalculationResult,_std::allocator<CalculationResult>_> *)&local_60);
    lVar2 = std::chrono::_V2::system_clock::now();
    local_a0 = (double)(lVar2 - lVar1) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_98,&local_a0);
  }
  std::
  _Tuple_impl<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<PixelColor,std::allocator<PixelColor>>&,std::vector<double,std::allocator<double>>&,void>
            (in_RDI,(vector<PixelColor,_std::allocator<PixelColor>_> *)&local_78,
             (vector<double,_std::allocator<double>_> *)&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  std::_Vector_base<PixelColor,_std::allocator<PixelColor>_>::~_Vector_base(&local_78);
  std::_Vector_base<CalculationResult,_std::allocator<CalculationResult>_>::~_Vector_base(&local_60)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return (long)in_RDI;
}

Assistant:

auto go(const ImageSize& image, const Section& section, const int max_iterations, const Gradient& gradient, const int repetitions) noexcept
{
    // iterations_histogram: for simplicity we only use indices [1] .. [max_iterations], [0] is unused
    std::vector<int> iterations_histogram(static_cast<std::size_t>(max_iterations + 1));

    // For every point store a tuple consisting of the final iteration and (for escaped points)
    // the distance to the next iteration (as value of 0.0 .. 1.0).
    std::vector<CalculationResult> results_per_point(static_cast<std::size_t>(image.width * image.height));

    std::vector<PixelColor> image_data(static_cast<std::size_t>(image.width * image.height));
    std::vector<double> durations;

    for (int i = 0; i < repetitions; ++i) {
        const auto t1 = std::chrono::high_resolution_clock::now();
        mandelbrot_calc(image, section, max_iterations, iterations_histogram, results_per_point);
        mandelbrot_colorize(max_iterations, gradient, image_data, iterations_histogram, results_per_point);
        const auto t2 = std::chrono::high_resolution_clock::now();

        durations.push_back(std::chrono::duration<double>{t2 - t1}.count());
    }

    return std::make_tuple(image_data, durations);
}